

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

sexp sexp_sqrt(sexp ctx,sexp self,sexp_sint_t n,sexp z)

{
  double f;
  sexp psVar1;
  sexp_sint_t n_00;
  sexp rem;
  sexp_gc_var_t __sexp_gc_preserver1;
  sexp_gc_var_t __sexp_gc_preserver2;
  sexp local_68;
  sexp local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  
  local_68 = (sexp)0x43e;
  local_58.var = (sexp_conflict *)0x0;
  local_58.next = (sexp_gc_var_t *)0x0;
  local_60 = (sexp)&DAT_0000043e;
  local_48.var = (sexp_conflict *)0x0;
  local_48.next = (sexp_gc_var_t *)0x0;
  if (((ulong)z & 3) != 0) {
LAB_00129d39:
    psVar1 = sexp_inexact_sqrt(ctx,self,n,z);
    return psVar1;
  }
  if (z->tag == 0xd) {
    local_48.next = &local_58;
    local_58.next = (ctx->value).context.saves;
    (ctx->value).context.saves = local_48.next;
    local_48.var = &local_60;
    (ctx->value).context.saves = &local_48;
    local_58.var = &local_68;
    local_68 = sexp_sqrt(ctx,self,n,(z->value).type.name);
    local_60 = sexp_sqrt(ctx,self,n,(z->value).type.cpl);
    if ((((((ulong)local_68 & 1) == 0) && ((((ulong)local_68 & 2) != 0 || (local_68->tag != 0xc))))
        && ((((ulong)local_68 & 2) != 0 || (local_68->tag != 0xd)))) ||
       (((((ulong)local_60 & 1) == 0 && ((((ulong)local_60 & 2) != 0 || (local_60->tag != 0xc)))) &&
        ((((ulong)local_60 & 2) != 0 || (local_60->tag != 0xd)))))) {
      local_68 = sexp_inexact_sqrt(ctx,self,n_00,z);
    }
    else {
      local_68 = sexp_make_ratio(ctx,local_68,local_60);
    }
    (ctx->value).context.saves = local_58.next;
  }
  else {
    if (z->tag != 0xc) goto LAB_00129d39;
    local_48.next = &local_58;
    local_58.next = (ctx->value).context.saves;
    (ctx->value).context.saves = local_48.next;
    local_48.var = &local_60;
    (ctx->value).context.saves = &local_48;
    local_58.var = &local_68;
    local_68 = sexp_bignum_sqrt(ctx,z,local_48.var);
    local_60 = sexp_bignum_normalize(local_60);
    if (local_60 != (sexp)&DAT_00000001) {
      if (((ulong)local_68 & 1) == 0) {
        f = sexp_bignum_to_double(local_68);
      }
      else {
        f = (double)((long)local_68 >> 1);
      }
      local_68 = sexp_make_flonum(ctx,f);
    }
    (ctx->value).context.saves = local_58.next;
  }
  return local_68;
}

Assistant:

sexp sexp_sqrt (sexp ctx, sexp self, sexp_sint_t n, sexp z) {
#if SEXP_USE_BIGNUMS || SEXP_USE_RATIOS
  sexp_gc_var2(res, rem);
#endif
#if SEXP_USE_BIGNUMS
  if (sexp_bignump(z)) {
    sexp_gc_preserve2(ctx, res, rem);
    res = sexp_bignum_sqrt(ctx, z, &rem);
    rem = sexp_bignum_normalize(rem);
    if (rem != SEXP_ZERO)
      res = sexp_make_flonum(ctx, sexp_fixnump(res) ? sexp_unbox_fixnum(res) : sexp_bignum_to_double(res));
    sexp_gc_release2(ctx);
    return res;
  }
#endif
#if SEXP_USE_RATIOS
  if (sexp_ratiop(z)) {
    sexp_gc_preserve2(ctx, res, rem);
    res = sexp_sqrt(ctx, self, n, sexp_ratio_numerator(z));
    rem = sexp_sqrt(ctx, self, n, sexp_ratio_denominator(z));
    if (sexp_exactp(res) && sexp_exactp(rem)) {
      res = sexp_make_ratio(ctx, res, rem);
    } else {
      res = sexp_inexact_sqrt(ctx, self, n, z);
    }
    sexp_gc_release2(ctx);
    return res;
  }
#endif
  return sexp_inexact_sqrt(ctx, self, n, z);
}